

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ElemExpr *out_elem_expr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  Var local_1c0;
  ElemExpr local_178;
  uint local_128;
  Enum local_124;
  Location local_120;
  undefined1 local_100 [8];
  Var var;
  undefined1 auStack_40 [6];
  bool lpar;
  bool item;
  Location loc;
  ElemExpr *out_elem_expr_local;
  WastParser *this_local;
  
  loc.field_1._8_8_ = out_elem_expr;
  GetLocation((Location *)auStack_40,this);
  bVar1 = MatchLpar(this,Item);
  bVar2 = Match(this,Lpar);
  bVar3 = Match(this,RefNull);
  if (bVar3) {
    bVar3 = Features::bulk_memory_enabled(&this->options_->features);
    if ((!bVar3) && (bVar3 = Features::reference_types_enabled(&this->options_->features), !bVar3))
    {
      Error(this,0x2fc616);
    }
    ElemExpr::ElemExpr((ElemExpr *)((long)&var.field_2 + 0x18));
    ElemExpr::operator=((ElemExpr *)loc.field_1._8_8_,(ElemExpr *)((long)&var.field_2 + 0x18));
    ElemExpr::~ElemExpr((ElemExpr *)((long)&var.field_2 + 0x18));
  }
  else {
    bVar3 = Match(this,RefFunc);
    if (!bVar3) {
      this_local._7_1_ = 0;
      goto LAB_00274150;
    }
    Location::Location(&local_120);
    Var::Var((Var *)local_100,0xffffffff,&local_120);
    local_124 = (Enum)ParseVar(this,(Var *)local_100);
    bVar3 = Failed((Result)local_124);
    if (bVar3) {
      this_local._7_1_ = 1;
    }
    else {
      Var::Var(&local_1c0,(Var *)local_100);
      ElemExpr::ElemExpr(&local_178,&local_1c0);
      ElemExpr::operator=((ElemExpr *)loc.field_1._8_8_,&local_178);
      ElemExpr::~ElemExpr(&local_178);
      Var::~Var(&local_1c0);
    }
    local_128 = (uint)bVar3;
    Var::~Var((Var *)local_100);
    if (local_128 != 0) goto LAB_00274150;
  }
  if (bVar2) {
    RVar4 = Expect(this,Rpar);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      this_local._7_1_ = 1;
      goto LAB_00274150;
    }
  }
  if (bVar1) {
    RVar4 = Expect(this,Rpar);
    bVar1 = Failed(RVar4);
    if (bVar1) {
      this_local._7_1_ = 1;
      goto LAB_00274150;
    }
  }
  this_local._7_1_ = 1;
LAB_00274150:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool WastParser::ParseElemExprOpt(ElemExpr* out_elem_expr) {
  Location loc = GetLocation();
  bool item = MatchLpar(TokenType::Item);
  bool lpar = Match(TokenType::Lpar);
  if (Match(TokenType::RefNull)) {
    if (!(options_->features.bulk_memory_enabled() ||
          options_->features.reference_types_enabled())) {
      Error(loc, "ref.null not allowed");
    }
    *out_elem_expr = ElemExpr();
  } else if (Match(TokenType::RefFunc)) {
    Var var;
    CHECK_RESULT(ParseVar(&var));
    *out_elem_expr = ElemExpr(var);
  } else {
    return false;
  }
  if (lpar) {
    EXPECT(Rpar);
  }
  if (item) {
    EXPECT(Rpar);
  }
  return true;
}